

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall
xray_re::xr_reader::
r_chunks<std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>,xray_re::xr_reader::f_r_new<xray_re::xr_bone>>
          (xr_reader *this,
          vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_> *container,
          f_r_new<xray_re::xr_bone> read)

{
  uint32_t id;
  uint32_t id_00;
  xr_reader *local_50;
  xr_bone *local_48;
  f_r_new<xray_re::xr_bone> local_40;
  
  id_00 = 0;
  while( true ) {
    local_50 = open_chunk(this,id_00);
    if (local_50 == (xr_reader *)0x0) break;
    local_48 = (xr_bone *)0x0;
    std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>::
    emplace_back<xray_re::xr_bone*>
              ((vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>> *)container,&local_48);
    f_r_new<xray_re::xr_bone>::operator()
              (&local_40,
               (container->
               super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1,local_50);
    close_chunk(this,&local_50);
    id_00 = id_00 + 1;
  }
  return;
}

Assistant:

inline void xr_reader::r_chunks(T& container, F read)
{
	xr_reader* s;
	for (uint32_t id = 0; (s = open_chunk(id)); ++id) {
		container.push_back(typename T::value_type());
		read(container.back(), *s);
		close_chunk(s);
	}
}